

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O3

void __thiscall ftxui::Screen::Screen(Screen *this,int dimx,int dimy)

{
  allocator_type local_32;
  allocator_type local_31;
  vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> local_30;
  
  (this->stencil).x_min = 0;
  (this->stencil).x_max = dimx + -1;
  (this->stencil).y_min = 0;
  (this->stencil).y_max = dimy + -1;
  this->dimx_ = dimx;
  this->dimy_ = dimy;
  std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::vector(&local_30,(long)dimx,&local_31);
  std::
  vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
  ::vector(&this->pixels_,(long)dimy,&local_30,&local_32);
  std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::~vector(&local_30);
  (this->cursor_).x = 0;
  (this->cursor_).y = 0;
  return;
}

Assistant:

Screen::Screen(int dimx, int dimy)
    : stencil{0, dimx - 1, 0, dimy - 1},
      dimx_(dimx),
      dimy_(dimy),
      pixels_(dimy, std::vector<Pixel>(dimx)) {
#if defined(_WIN32)
  // The placement of this call is a bit weird, however we can assume that
  // anybody who instantiates a Screen object eventually wants to output
  // something to the console.
  // As we require UTF8 for all input/output operations we will just switch to
  // UTF8 encoding here
  SetConsoleOutputCP(CP_UTF8);
  SetConsoleCP(CP_UTF8);
  WindowsEmulateVT100Terminal();
#endif
}